

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

Comment * soul::SourceCodeUtilities::findPrecedingComment
                    (Comment *__return_storage_ptr__,CodeLocation *location)

{
  CodeLocation local_38;
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *location_local;
  
  local_18 = location;
  location_local = (CodeLocation *)__return_storage_ptr__;
  CodeLocation::getStartOfLine(&local_38);
  findStartOfPrecedingComment((SourceCodeUtilities *)&local_28,&local_38);
  parseComment(__return_storage_ptr__,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  CodeLocation::~CodeLocation(&local_38);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::findPrecedingComment (CodeLocation location)
{
    return parseComment (findStartOfPrecedingComment (location.getStartOfLine()));
}